

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

PAL_ERROR PrepareStandardHandle(CPalThread *pThread,HANDLE hFile,IPalObject **ppobjFile,int *piFd)

{
  int iVar1;
  long lStack_48;
  int iError;
  CFileProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjFile;
  int *piStack_28;
  PAL_ERROR palError;
  int *piFd_local;
  IPalObject **ppobjFile_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pobjFile._4_4_ = 0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  lStack_48 = 0;
  piStack_28 = piFd;
  piFd_local = (int *)ppobjFile;
  ppobjFile_local = (IPalObject **)hFile;
  hFile_local = pThread;
  pobjFile._4_4_ =
       (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                 (CorUnix::g_pObjectManager,pThread,hFile,CorUnix::aotFile,0,&pDataLock);
  if (pobjFile._4_4_ == 0) {
    pobjFile._4_4_ =
         (*pDataLock->_vptr_IDataLock[3])
                   (pDataLock,hFile_local,0,&pLocalData,&stack0xffffffffffffffb8);
    if (pobjFile._4_4_ == 0) {
      if (*(int *)(lStack_48 + 0x1018) == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pobjFile._4_4_ = 6;
      }
      else {
        iVar1 = fcntl64(*(undefined4 *)(lStack_48 + 8),2,0);
        if (iVar1 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pobjFile._4_4_ = 6;
        }
        else {
          *piStack_28 = *(int *)(lStack_48 + 8);
          (*(code *)pLocalData->pLockController->_vptr_IFileLockController)
                    (pLocalData,hFile_local,0);
          pLocalData = (CFileProcessLocalData *)0x0;
          *(IDataLock **)piFd_local = pDataLock;
          pDataLock = (IDataLock *)0x0;
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","PrepareStandardHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x1ba);
      fprintf(_stderr,"Unable to access file data\n");
    }
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,hFile_local,0);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,hFile_local);
  }
  return pobjFile._4_4_;
}

Assistant:

PAL_ERROR
PrepareStandardHandle(
    CPalThread *pThread,
    HANDLE hFile,
    IPalObject **ppobjFile,
    int *piFd
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    int iError = 0;

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        0,
        &pobjFile
        );

    if (NO_ERROR != palError)
    {
        ERROR("Bad handle passed through CreateProcess\n");
        goto PrepareStandardHandleExit;
    }

    palError = pobjFile->GetProcessLocalData(
        pThread,
        ReadLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to access file data\n");
        goto PrepareStandardHandleExit;
    }

    //
    // The passed in file needs to be inheritable
    //

    if (!pLocalData->inheritable)
    {
        ERROR("Non-inheritable handle passed through CreateProcess\n");
        palError = ERROR_INVALID_HANDLE;
        goto PrepareStandardHandleExit;
    }

    iError = fcntl(pLocalData->unix_fd, F_SETFD, 0);
    if (-1 == iError)
    {
        ERROR("Unable to remove close-on-exec for file (errno %i)\n", errno);
        palError = ERROR_INVALID_HANDLE;
        goto PrepareStandardHandleExit;
    }

    *piFd = pLocalData->unix_fd;
    pDataLock->ReleaseLock(pThread, FALSE);
    pDataLock = NULL;

    //
    // Transfer pobjFile reference to out parameter
    //

    *ppobjFile = pobjFile;
    pobjFile = NULL;

PrepareStandardHandleExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pobjFile)
    {
        pobjFile->ReleaseReference(pThread);
    }

    return palError;
}